

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

pair<int,_int> __thiscall libtorrent::aux::parse_utf8_codepoint(aux *this,string_view str)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  byte *pbVar5;
  pair<int,_int> pVar6;
  uint local_6c [7];
  byte local_4d;
  int local_4c;
  uint uStack_48;
  uint8_t b;
  int i;
  int32_t ch;
  int local_3c [4];
  int local_2c [2];
  int sequence_len;
  undefined1 local_20 [8];
  string_view str_local;
  
  str_local._M_len = str._M_len;
  local_20 = (undefined1  [8])this;
  bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  if (bVar1) {
    sequence_len = -1;
    local_2c[1] = 0;
    str_local._M_str = (char *)::std::make_pair<int,int>(&sequence_len,local_2c + 1);
  }
  else {
    pvVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
    iVar2 = anon_unknown_2::utf8_sequence_length(*pvVar3);
    local_2c[0] = iVar2;
    if (iVar2 == 1) {
      pvVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
      local_3c[3] = (int)*pvVar3;
      str_local._M_str = (char *)::std::make_pair<int,int_const&>(local_3c + 3,local_2c);
    }
    else if (iVar2 == 0) {
      local_3c[2] = 0xffffffff;
      local_3c[1] = 1;
      str_local._M_str = (char *)::std::make_pair<int,int>(local_3c + 2,local_3c + 1);
    }
    else if (iVar2 < 5) {
      sVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
      if ((int)sVar4 < iVar2) {
        ch = -1;
        sVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
        i = (int)sVar4;
        str_local._M_str = (char *)::std::make_pair<int,int>(&ch,&i);
      }
      else {
        uStack_48 = 0;
        switch(local_2c[0]) {
        case 1:
          pvVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
          uStack_48 = (int)*pvVar3 & 0x7f;
          break;
        case 2:
          pvVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
          uStack_48 = (int)*pvVar3 & 0x1f;
          break;
        case 3:
          pvVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
          uStack_48 = (int)*pvVar3 & 0xf;
          break;
        case 4:
          pvVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_20,0);
          uStack_48 = (int)*pvVar3 & 7;
        }
        for (local_4c = 1; local_4c < local_2c[0]; local_4c = local_4c + 1) {
          pbVar5 = (byte *)::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20,
                                      (long)local_4c);
          local_4d = *pbVar5;
          if ((0xbf < local_4d) || (local_4d < 0x80)) {
            local_6c[6] = 0xffffffff;
            pVar6 = ::std::make_pair<int,int_const&>((int *)(local_6c + 6),local_2c);
            return pVar6;
          }
          uStack_48 = (local_4d & 0x3f) + uStack_48 * 0x40;
        }
        if (local_2c[0] == 2) {
          if ((int)uStack_48 < 0x80) {
            local_6c[5] = 0xffffffff;
            pVar6 = ::std::make_pair<int,int_const&>((int *)(local_6c + 5),local_2c);
            return pVar6;
          }
        }
        else if (local_2c[0] == 3) {
          if ((int)uStack_48 < 0x800) {
            local_6c[4] = 0xffffffff;
            pVar6 = ::std::make_pair<int,int_const&>((int *)(local_6c + 4),local_2c);
            return pVar6;
          }
        }
        else if ((local_2c[0] == 4) && ((int)uStack_48 < 0x10000)) {
          local_6c[3] = 0xffffffff;
          pVar6 = ::std::make_pair<int,int_const&>((int *)(local_6c + 3),local_2c);
          return pVar6;
        }
        if ((int)uStack_48 < 0x110000) {
          if (((int)uStack_48 < 0xd800) || (0xdfff < (int)uStack_48)) {
            local_6c[0] = uStack_48;
            str_local._M_str = (char *)::std::make_pair<int,int_const&>((int *)local_6c,local_2c);
          }
          else {
            local_6c[1] = 0xffffffff;
            str_local._M_str =
                 (char *)::std::make_pair<int,int_const&>((int *)(local_6c + 1),local_2c);
          }
        }
        else {
          local_6c[2] = 0xffffffff;
          str_local._M_str =
               (char *)::std::make_pair<int,int_const&>((int *)(local_6c + 2),local_2c);
        }
      }
    }
    else {
      local_3c[0] = -1;
      str_local._M_str = (char *)::std::make_pair<int,int_const&>(local_3c,local_2c);
    }
  }
  return (pair<int,_int>)str_local._M_str;
}

Assistant:

std::pair<std::int32_t, int> parse_utf8_codepoint(string_view str)
	{
		TORRENT_ASSERT(!str.empty());
		if (str.empty()) return std::make_pair(-1, 0);

		int const sequence_len = utf8_sequence_length(str[0]);

		// this is likely the most common case
		if (sequence_len == 1) return std::make_pair(std::int32_t(str[0]), sequence_len);

		// if we find an invalid sequence length, skip one byte
		if (sequence_len == 0)
			return std::make_pair(-1, 1);

		if (sequence_len > 4)
			return std::make_pair(-1, sequence_len);

		if (sequence_len > int(str.size()))
			return std::make_pair(-1, static_cast<int>(str.size()));

		std::int32_t ch = 0;
		// first byte
		switch (sequence_len)
		{
			case 1:
				ch = str[0] & 0b01111111;
				break;
			case 2:
				ch = str[0] & 0b00011111;
				break;
			case 3:
				ch = str[0] & 0b00001111;
				break;
			case 4:
				ch = str[0] & 0b00000111;
				break;
		}
		for (int i = 1; i < sequence_len; ++i)
		{
			auto const b = static_cast<std::uint8_t>(str[static_cast<std::size_t>(i)]);
			// continuation bytes must start with 10xxxxxx
			if (b > 0b10111111 || b < 0b10000000)
				return std::make_pair(-1, sequence_len);
			ch <<= 6;
			ch += b & 0b111111;
		}

		// check if the sequence is overlong, i.e. whether it has leading
		// (redundant) zeros
		switch (sequence_len)
		{
			case 2:
				if (ch < 0x80) return std::make_pair(-1, sequence_len);
				break;
			case 3:
				if (ch < 0x800) return std::make_pair(-1, sequence_len);
				break;
			case 4:
				if (ch < 0x10000) return std::make_pair(-1, sequence_len);
				break;
		}

		if (ch > max_codepoint)
			return std::make_pair(-1, sequence_len);

		// per RFC 3629, surrogates should not appear in utf-8
		if (ch >= surrogate_start && ch <= surrogate_end)
			return std::make_pair(-1, sequence_len);

		return std::make_pair(static_cast<std::int32_t>(ch), sequence_len);
	}